

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

EnumSchema __thiscall capnp::Schema::asEnum(Schema *this)

{
  bool bVar1;
  Reader local_90;
  ArrayPtr<const_char> local_60;
  Fault local_50;
  Fault f;
  Schema *this_local;
  
  getProto((Reader *)&f,this);
  bVar1 = capnp::schema::Node::Reader::isEnum((Reader *)&f);
  if (bVar1) {
    EnumSchema::EnumSchema((EnumSchema *)&this_local,(Schema)this->raw);
  }
  else {
    getProto(&local_90,this);
    local_60 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_90);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41],capnp::Text::Reader>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x115,FAILED,"getProto().isEnum()",
               "\"Tried to use non-enum schema as an enum.\", getProto().getDisplayName()",
               (char (*) [41])"Tried to use non-enum schema as an enum.",(Reader *)&local_60);
    EnumSchema::EnumSchema((EnumSchema *)&this_local);
    kj::_::Debug::Fault::~Fault(&local_50);
  }
  return (EnumSchema)(Schema)this_local;
}

Assistant:

EnumSchema Schema::asEnum() const {
  KJ_REQUIRE(getProto().isEnum(), "Tried to use non-enum schema as an enum.",
             getProto().getDisplayName()) {
    return EnumSchema();
  }
  return EnumSchema(*this);
}